

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall sznet::net::Connector::retry(Connector *this,sz_sock sockfd)

{
  int iVar1;
  EventLoop *this_00;
  LogLevel LVar2;
  LogStream *pLVar3;
  self *psVar4;
  int *piVar5;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_2080 [12];
  Logger local_2070;
  int local_109c;
  TimerId local_1098;
  enable_shared_from_this<sznet::net::Connector> local_1088;
  code *local_1078;
  undefined8 local_1070;
  type local_1068;
  TimerCallback local_1048;
  InetAddress local_1028;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  sz_sock local_14;
  Connector *pCStack_10;
  sz_sock sockfd_local;
  Connector *this_local;
  
  local_14 = sockfd;
  pCStack_10 = this;
  sockets::sz_closesocket(sockfd);
  setState(this,kDisconnected);
  if ((this->m_connect & 1U) == 0) {
    LVar2 = Logger::logLevel();
    if ((int)LVar2 < 2) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_2080,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_2080._0_8_;
      file_00.m_size = local_2080._8_4_;
      Logger::Logger(&local_2070,file_00,0xe4,DEBUG,"retry");
      pLVar3 = Logger::stream(&local_2070);
      LogStream::operator<<(pLVar3,"do not connect");
      Logger::~Logger(&local_2070);
    }
  }
  else {
    LVar2 = Logger::logLevel();
    if ((int)LVar2 < 3) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_ff8,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_ff8._0_8_;
      file.m_size = local_ff8._8_4_;
      Logger::Logger(&local_fe8,file,0xdc);
      pLVar3 = Logger::stream(&local_fe8);
      psVar4 = LogStream::operator<<(pLVar3,"Connector::retry - Retry connecting to ");
      InetAddress::toIpPort_abi_cxx11_(&local_1028);
      psVar4 = LogStream::operator<<(psVar4,(string *)&local_1028);
      psVar4 = LogStream::operator<<(psVar4," in ");
      pLVar3 = LogStream::operator<<(psVar4,this->m_retryDelayMs);
      LogStream::operator<<(pLVar3," milliseconds. ");
      std::__cxx11::string::~string((string *)&local_1028);
      Logger::~Logger(&local_fe8);
    }
    this_00 = this->m_loop;
    iVar1 = this->m_retryDelayMs;
    local_1078 = startInLoop;
    local_1070 = 0;
    std::enable_shared_from_this<sznet::net::Connector>::shared_from_this(&local_1088);
    std::bind<void(sznet::net::Connector::*)(),std::shared_ptr<sznet::net::Connector>>
              (&local_1068,(offset_in_Connector_to_subr *)&local_1078,
               (shared_ptr<sznet::net::Connector> *)&local_1088);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::Connector::*(std::shared_ptr<sznet::net::Connector>))()>,void>
              ((function<void()> *)&local_1048,&local_1068);
    local_1098 = EventLoop::runAfter(this_00,(double)iVar1 / 1000.0,&local_1048);
    std::function<void_()>::~function(&local_1048);
    std::_Bind<void_(sznet::net::Connector::*(std::shared_ptr<sznet::net::Connector>))()>::~_Bind
              (&local_1068);
    std::shared_ptr<sznet::net::Connector>::~shared_ptr
              ((shared_ptr<sznet::net::Connector> *)&local_1088);
    local_109c = this->m_retryDelayMs << 1;
    piVar5 = std::min<int>(&local_109c,&kMaxRetryDelayMs);
    this->m_retryDelayMs = *piVar5;
  }
  return;
}

Assistant:

void Connector::retry(sockets::sz_sock sockfd)
{
	sockets::sz_closesocket(sockfd);
	setState(kDisconnected);
	if (m_connect)
	{
		LOG_INFO << "Connector::retry - Retry connecting to " << m_serverAddr.toIpPort()
			<< " in " << m_retryDelayMs << " milliseconds. ";
		m_loop->runAfter(m_retryDelayMs / 1000.0, std::bind(&Connector::startInLoop, shared_from_this()));
		// �����ӳټӱ����������������ӳ�
		m_retryDelayMs = std::min(m_retryDelayMs * 2, kMaxRetryDelayMs);
	}
	else
	{
		LOG_DEBUG << "do not connect";
	}
}